

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitCall(ParseNodeCall *pnodeCall,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
             BOOL fReturnValue,BOOL fEvaluateComponents,RegSlot overrideThisLocation,
             RegSlot newTargetLocation)

{
  undefined1 *puVar1;
  byte bVar2;
  ParseableFunctionInfo *pPVar3;
  code *pcVar4;
  ParseNodePtr pnode;
  uint16 uVar5;
  bool bVar6;
  uint uVar7;
  undefined4 *puVar8;
  FunctionInfo *pFVar9;
  RegSlot thisLocation_00;
  uint16 uVar10;
  BOOL BVar11;
  uint uVar12;
  AuxArray<unsigned_int> *local_88;
  AuxArray<unsigned_int> *spreadIndices;
  BOOL local_78;
  BOOL local_74;
  BOOL fSideEffectArgs;
  uint local_6c;
  ParseNodePtr local_68;
  ParseNodeCall *local_60;
  FuncInfo *local_58;
  uint16 local_4a;
  ByteCodeGenerator *local_48;
  RegSlot local_40;
  RegSlot local_3c;
  RegSlot thisLocation;
  RegSlot callObjLocation;
  ProfileId callApplyCallSiteId;
  ProfileId callSiteId;
  bool releaseThisLocation;
  BOOL *pSideEffect;
  
  local_58 = (FuncInfo *)CONCAT44(local_58._4_4_,overrideThisLocation);
  local_40 = 0xffffffff;
  local_3c = 0xffffffff;
  local_78 = 0;
  bVar2 = pnodeCall->field_0x24;
  local_48 = (ByteCodeGenerator *)pnodeCall->pnodeTarget;
  local_68 = pnodeCall->pnodeArgs;
  local_4a = pnodeCall->spreadArgCount;
  spreadIndices._0_4_ = fReturnValue;
  local_74 = fEvaluateComponents;
  local_60 = pnodeCall;
  bVar6 = CreateNativeArrays(byteCodeGenerator,funcInfo);
  if (bVar6) {
    CallTargetIsArray((ParseNode *)local_48);
  }
  pSideEffect = &local_78;
  uVar7 = CountArguments(local_68,pSideEffect);
  BVar11 = (BOOL)pSideEffect;
  uVar12 = (uint)(newTargetLocation != 0xffffffff);
  spreadIndices._4_4_ = *(uint *)&local_60->field_0x24 >> 2 & 1;
  fSideEffectArgs = uVar12;
  if (spreadIndices._4_4_ != 0) {
    if (newTargetLocation != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      BVar11 = 0x214d;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x214d,"(!fHasNewTarget)","!fHasNewTarget");
      if (!bVar6) goto LAB_00803576;
      *puVar8 = 0;
    }
    uVar12 = (uint)(1 < uVar7);
  }
  uVar12 = uVar12 + uVar7;
  local_6c = uVar7 & 0xffff;
  if (uVar12 < local_6c) {
    Js::Throw::OutOfMemory();
  }
  if ((BOOL)spreadIndices != 0) {
    puVar1 = &(local_60->super_ParseNode).field_0x1;
    *puVar1 = *puVar1 | 1;
  }
  callObjLocation._3_1_ = '\x01';
  thisLocation._2_2_ = -1;
  if ((bVar2 & 8) == 0) {
    if (local_74 == 0) {
      EmitCallTargetNoEvalComponents
                ((ParseNode *)local_48,BVar11,&local_40,(bool *)((long)&callObjLocation + 3),
                 &local_3c,byteCodeGenerator,funcInfo);
    }
    else {
      EmitCallTarget((ParseNode *)local_48,local_78,&local_40,(bool *)((long)&callObjLocation + 3),
                     &local_3c,byteCodeGenerator,funcInfo,(ProfileId *)((long)&thisLocation + 2));
    }
  }
  if ((RegSlot)local_58 != 0xffffffff) {
    local_40 = (RegSlot)local_58;
    callObjLocation._3_1_ = '\0';
  }
  FuncInfo::StartRecordingOutArgs(funcInfo,uVar12);
  bVar6 = Js::ByteCodeWriter::ShouldIncrementCallSiteId(&byteCodeGenerator->m_writer,CallI);
  callObjLocation._0_2_ = byteCodeGenerator->m_callSiteId;
  uVar10 = (uint16)callObjLocation;
  if (bVar6) {
    if ((uint16)callObjLocation == 0xffff) {
      callObjLocation._0_2_ = 0xffff;
      uVar10 = 0xffff;
    }
    else {
      byteCodeGenerator->m_callSiteId = (uint16)callObjLocation + 1;
      uVar10 = (uint16)callObjLocation + 1;
    }
  }
  if (thisLocation._2_2_ != -1) {
    JsUtil::
    BaseDictionary<unsigned_short,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_short,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<unsigned_short,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)funcInfo->callSiteToCallApplyCallSiteMap,(unsigned_short *)&callObjLocation,
               (unsigned_short *)((long)&thisLocation + 2));
    uVar10 = byteCodeGenerator->m_callSiteId;
  }
  uVar5 = (uint16)callObjLocation;
  bVar6 = true;
  local_48 = byteCodeGenerator;
  if ((local_60->field_0x24 & 0x10) == 0) {
    pPVar3 = funcInfo->byteCodeFunction;
    pFVar9 = (pPVar3->super_FunctionProxy).functionInfo.ptr;
    local_58 = funcInfo;
    if (pFVar9 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar6) goto LAB_00803576;
      *puVar8 = 0;
      pFVar9 = (pPVar3->super_FunctionProxy).functionInfo.ptr;
    }
    if ((ParseableFunctionInfo *)(pFVar9->functionBodyImpl).ptr != pPVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar6) {
LAB_00803576:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
      pFVar9 = (pPVar3->super_FunctionProxy).functionInfo.ptr;
    }
    funcInfo = local_58;
    if ((pFVar9->attributes & (Async|Generator)) == None) {
      bVar6 = false;
    }
    else {
      bVar6 = local_60->pnodeArgs != (ParseNodePtr)0x0;
    }
  }
  pnode = local_68;
  BVar11 = local_74;
  uVar7 = spreadIndices._4_4_;
  local_58 = (FuncInfo *)(ulong)(uint16)callObjLocation;
  local_68 = (ParseNodePtr)CONCAT44(local_68._4_4_,local_40);
  EmitArgList(pnode,local_40,newTargetLocation,spreadIndices._4_4_,local_74,local_48,funcInfo,
              (uint16)callObjLocation,(ArgSlot)uVar12,bVar6,uVar5 != uVar10,local_4a,&local_88);
  if (BVar11 == 0) {
    EmitCallInstrNoEvalComponents
              (local_60,uVar7,fSideEffectArgs,(RegSlot)local_68,local_3c,local_6c,local_48,funcInfo,
               (uint16)callObjLocation,local_88);
  }
  else {
    thisLocation_00 = 0xffffffff;
    if (callObjLocation._3_1_ != '\0') {
      thisLocation_00 = (RegSlot)local_68;
    }
    EmitCallInstr(local_60,uVar7,fSideEffectArgs,thisLocation_00,local_3c,local_6c,local_48,funcInfo
                  ,(uint16)callObjLocation,local_88);
  }
  FuncInfo::EndRecordingOutArgs(funcInfo,(ArgSlot)uVar12);
  return;
}

Assistant:

void EmitCall(
    ParseNodeCall * pnodeCall,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    BOOL fReturnValue,
    BOOL fEvaluateComponents,
    Js::RegSlot overrideThisLocation,
    Js::RegSlot newTargetLocation)
{
    // If the call returns a float, we'll note this in the byte code.
    Js::RegSlot thisLocation = Js::Constants::NoRegister;
    Js::RegSlot callObjLocation = Js::Constants::NoRegister;
    BOOL fHasNewTarget = newTargetLocation != Js::Constants::NoRegister;
    BOOL fSideEffectArgs = FALSE;
    BOOL fIsSuperCall = pnodeCall->isSuperCall;
    ParseNode *pnodeTarget = pnodeCall->pnodeTarget;
    ParseNode *pnodeArgs = pnodeCall->pnodeArgs;
    uint16 spreadArgCount = pnodeCall->spreadArgCount;

    if (CreateNativeArrays(byteCodeGenerator, funcInfo) && CallTargetIsArray(pnodeTarget)) {
        // some minifiers (potentially incorrectly) assume that "v = new Array()" and "v = Array()" are equivalent,
        // and replace the former with the latter to save 4 characters. What that means for us is that it, at least
        // initially, uses the "Call" path. We want to guess that it _is_ just "new Array()" and change over to the
        // "new" path, since then our native array handling can kick in.
        /*EmitNew(pnode, byteCodeGenerator, funcInfo);
        return;*/
    }

    unsigned int argCount = CountArguments(pnodeArgs, &fSideEffectArgs);

    BOOL fIsEval = pnodeCall->isEvalCall;
    Js::ArgSlot argSlotCount = (Js::ArgSlot)argCount;

    if (fIsEval)
    {
        Assert(!fHasNewTarget);

        //
        // "eval" takes the closure environment as an extra argument
        // Pass the closure env only if some argument is passed
        // For just eval(), don't pass the closure environment
        //
        if (argCount > 1)
        {
            argCount++;
        }
    }
    else if (fHasNewTarget)
    {
        // When we need to pass new.target explicitly, it is passed as an extra argument.
        // This is similar to how eval passes an extra argument for the frame display and is
        // used to support cases where we need to pass both 'this' and new.target as part of
        // a function call.
        // OpCode::LdNewTarget knows how to look at the call flags and fetch this argument.
        argCount++;
    }

    // argCount indicates the total arguments count including the extra arguments.
    // argSlotCount indicates the actual arguments count. So argCount should always never be les sthan argSlotCount.
    if (argCount < (unsigned int)argSlotCount)
    {
        Js::Throw::OutOfMemory();
    }

    if (fReturnValue)
    {
        pnodeCall->isUsed = true;
    }

    //
    // Set up the call.
    //

    bool releaseThisLocation = true;

    // We already emit the call target for super calls in EmitSuperCall
    Js::ProfileId callApplyCallSiteId = Js::Constants::NoProfileId;
    if (!fIsSuperCall)
    {
        if (!fEvaluateComponents)
        {
            EmitCallTargetNoEvalComponents(pnodeTarget, fSideEffectArgs, &thisLocation, &releaseThisLocation, &callObjLocation, byteCodeGenerator, funcInfo);
        }
        else
        {
            EmitCallTarget(pnodeTarget, fSideEffectArgs, &thisLocation, &releaseThisLocation, &callObjLocation, byteCodeGenerator, funcInfo, &callApplyCallSiteId);
        }
    }

    // If we are strictly overriding the this location, ignore what the call target set this location to.
    if (overrideThisLocation != Js::Constants::NoRegister)
    {
        thisLocation = overrideThisLocation;
        releaseThisLocation = false;
    }

    // Evaluate the arguments (nothing mode-specific here).
    // Start call, allocate out param space
    // We have to use the arguments count including the extra args to Start Call as we use it to allocated space for all the args
    funcInfo->StartRecordingOutArgs(argCount);

    Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);
    if (callApplyCallSiteId != Js::Constants::NoProfileId)
    {
        funcInfo->callSiteToCallApplyCallSiteMap->AddNew(callSiteId, callApplyCallSiteId);
    }

    // Only emit profiled argouts if we're going to allocate callSiteInfo (on the DynamicProfileInfo) for this call.
    bool emitProfiledArgouts = callSiteId != byteCodeGenerator->GetCurrentCallSiteId();

    // Emit argouts at end for generators so that we don't need to restore them when bailing in
    bool emitArgOutsAtEnd = pnodeCall->hasDestructuring || (funcInfo->byteCodeFunction->IsCoroutine() && pnodeCall->pnodeArgs != nullptr);
    Js::AuxArray<uint32> *spreadIndices;
    EmitArgList(pnodeArgs, thisLocation, newTargetLocation, fIsEval, fEvaluateComponents, byteCodeGenerator, funcInfo, callSiteId, (Js::ArgSlot)argCount, emitArgOutsAtEnd, emitProfiledArgouts, spreadArgCount, &spreadIndices);

    if (!fEvaluateComponents)
    {
        EmitCallInstrNoEvalComponents(pnodeCall, fIsEval, fHasNewTarget, thisLocation, callObjLocation, argSlotCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
    }
    else
    {
        EmitCallInstr(pnodeCall, fIsEval, fHasNewTarget, releaseThisLocation ? thisLocation : Js::Constants::NoRegister, callObjLocation, argSlotCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
    }

    // End call, pop param space
    funcInfo->EndRecordingOutArgs((Js::ArgSlot)argCount);
}